

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O3

void duckdb::AggregateExecutor::
     UnaryUpdate<duckdb::BitAggState<duckdb::hugeint_t>,duckdb::hugeint_t,duckdb::BitStringAggOperation>
               (Vector *input,AggregateInputData *aggr_input_data,data_ptr_t state,idx_t count)

{
  data_ptr_t pdVar1;
  ulong uVar2;
  sel_t *psVar3;
  unsigned_long *puVar4;
  unsigned_long *puVar5;
  unsigned_long *puVar6;
  unsigned_long *puVar7;
  unsigned_long *puVar8;
  unsigned_long *puVar9;
  AggregateUnaryInput *pAVar10;
  ulong uVar11;
  long lVar12;
  idx_t iVar13;
  unsigned_long *puVar14;
  unsigned_long *puVar15;
  AggregateUnaryInput input_data;
  hugeint_t local_90;
  idx_t local_80;
  undefined1 local_78 [32];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_58;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  if (input->vector_type == FLAT_VECTOR) {
    pdVar1 = input->data;
    FlatVector::VerifyFlatVector(input);
    local_78._16_8_ = (unsigned_long *)0x0;
    if (0x3f < count + 0x3f) {
      puVar8 = (unsigned_long *)0x0;
      uVar11 = 0;
      puVar14 = (unsigned_long *)0x0;
      local_78._0_8_ = aggr_input_data;
      local_78._8_8_ = &input->validity;
      do {
        puVar15 = (input->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        pAVar10 = (AggregateUnaryInput *)count;
        if (puVar15 == (unsigned_long *)0x0) {
          puVar15 = puVar14 + 8;
          if (count <= puVar14 + 8) {
            puVar15 = (unsigned_long *)count;
          }
joined_r0x018b51f1:
          while (puVar9 = puVar8, puVar5 = puVar8, puVar6 = (unsigned_long *)local_78._16_8_,
                puVar8 < puVar15) {
            BitStringAggOperation::
            Operation<duckdb::hugeint_t,duckdb::BitAggState<duckdb::hugeint_t>,duckdb::BitStringAggOperation>
                      ((BitStringAggOperation *)state,
                       (BitAggState<duckdb::hugeint_t> *)(pdVar1 + (long)puVar8 * 0x10),
                       (hugeint_t *)local_78,pAVar10);
            puVar8 = (unsigned_long *)(local_78._16_8_ + 1);
            local_78._16_8_ = puVar8;
          }
        }
        else {
          uVar2 = puVar15[uVar11];
          puVar15 = puVar14 + 8;
          if (count <= puVar14 + 8) {
            puVar15 = (unsigned_long *)count;
          }
          if (uVar2 == 0xffffffffffffffff) goto joined_r0x018b51f1;
          puVar9 = puVar15;
          puVar5 = puVar15;
          puVar6 = puVar15;
          puVar7 = puVar14;
          puVar4 = (unsigned_long *)local_78._16_8_;
          if (uVar2 != 0) {
            while (local_78._16_8_ = puVar7, puVar9 = (unsigned_long *)local_78._16_8_,
                  puVar5 = puVar8, puVar6 = puVar4, (ulong)local_78._16_8_ < puVar15) {
              if ((uVar2 >> ((ulong)(uint)((int)local_78._16_8_ - (int)puVar14) & 0x3f) & 1) != 0) {
                lVar12 = local_78._16_8_ * 0x10;
                local_78._16_8_ = puVar4;
                BitStringAggOperation::
                Operation<duckdb::hugeint_t,duckdb::BitAggState<duckdb::hugeint_t>,duckdb::BitStringAggOperation>
                          ((BitStringAggOperation *)state,
                           (BitAggState<duckdb::hugeint_t> *)(pdVar1 + lVar12),(hugeint_t *)local_78
                           ,pAVar10);
              }
              puVar8 = (unsigned_long *)(local_78._16_8_ + 1);
              puVar4 = puVar8;
              puVar7 = puVar8;
            }
          }
        }
        local_78._16_8_ = puVar6;
        puVar8 = puVar5;
        uVar11 = uVar11 + 1;
        puVar14 = puVar9;
      } while (uVar11 != count + 0x3f >> 6);
    }
  }
  else if (input->vector_type == CONSTANT_VECTOR) {
    puVar8 = (input->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    if ((puVar8 == (unsigned_long *)0x0) || ((*puVar8 & 1) != 0)) {
      local_78._8_8_ = &input->validity;
      local_78._16_8_ = (unsigned_long *)0x0;
      local_78._0_8_ = aggr_input_data;
      BitStringAggOperation::
      Operation<duckdb::hugeint_t,duckdb::BitAggState<duckdb::hugeint_t>,duckdb::BitStringAggOperation>
                ((BitStringAggOperation *)state,(BitAggState<duckdb::hugeint_t> *)input->data,
                 (hugeint_t *)local_78,(AggregateUnaryInput *)count);
    }
  }
  else {
    UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_78);
    Vector::ToUnifiedFormat(input,count,(UnifiedVectorFormat *)local_78);
    pAVar10 = (AggregateUnaryInput *)(local_78 + 0x10);
    local_90.lower = (uint64_t)aggr_input_data;
    local_90.upper = (int64_t)pAVar10;
    if ((unsigned_long *)local_78._16_8_ == (unsigned_long *)0x0) {
      if (count != 0) {
        psVar3 = *(sel_t **)local_78._0_8_;
        iVar13 = 0;
        do {
          local_80 = iVar13;
          if (psVar3 != (sel_t *)0x0) {
            local_80 = (idx_t)psVar3[iVar13];
          }
          BitStringAggOperation::
          Operation<duckdb::hugeint_t,duckdb::BitAggState<duckdb::hugeint_t>,duckdb::BitStringAggOperation>
                    ((BitStringAggOperation *)state,
                     (BitAggState<duckdb::hugeint_t> *)(local_78._8_8_ + local_80 * 0x10),&local_90,
                     pAVar10);
          iVar13 = iVar13 + 1;
        } while (count != iVar13);
      }
    }
    else if (count != 0) {
      psVar3 = *(sel_t **)local_78._0_8_;
      iVar13 = 0;
      do {
        local_80 = iVar13;
        if (psVar3 != (sel_t *)0x0) {
          local_80 = (idx_t)psVar3[iVar13];
        }
        if (((unsigned_long *)local_78._16_8_ == (unsigned_long *)0x0) ||
           (pAVar10 = (AggregateUnaryInput *)(local_80 >> 6),
           (*(ulong *)(local_78._16_8_ + pAVar10 * 8) >> (local_80 & 0x3f) & 1) != 0)) {
          BitStringAggOperation::
          Operation<duckdb::hugeint_t,duckdb::BitAggState<duckdb::hugeint_t>,duckdb::BitStringAggOperation>
                    ((BitStringAggOperation *)state,
                     (BitAggState<duckdb::hugeint_t> *)(local_78._8_8_ + local_80 * 0x10),&local_90,
                     pAVar10);
        }
        iVar13 = iVar13 + 1;
      } while (count != iVar13);
    }
    if (local_38._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38._M_pi);
    }
    if (local_58._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58._M_pi);
    }
  }
  return;
}

Assistant:

static void UnaryUpdate(Vector &input, AggregateInputData &aggr_input_data, data_ptr_t state, idx_t count) {
		switch (input.GetVectorType()) {
		case VectorType::CONSTANT_VECTOR: {
			if (OP::IgnoreNull() && ConstantVector::IsNull(input)) {
				return;
			}
			auto idata = ConstantVector::GetData<INPUT_TYPE>(input);
			AggregateUnaryInput input_data(aggr_input_data, ConstantVector::Validity(input));
			OP::template ConstantOperation<INPUT_TYPE, STATE_TYPE, OP>(*reinterpret_cast<STATE_TYPE *>(state), *idata,
			                                                           input_data, count);
			break;
		}
#ifndef DUCKDB_SMALLER_BINARY
		case VectorType::FLAT_VECTOR: {
			auto idata = FlatVector::GetData<INPUT_TYPE>(input);
			UnaryFlatUpdateLoop<STATE_TYPE, INPUT_TYPE, OP>(idata, aggr_input_data, (STATE_TYPE *)state, count,
			                                                FlatVector::Validity(input));
			break;
		}
#endif
		default: {
			UnifiedVectorFormat idata;
			input.ToUnifiedFormat(count, idata);
			UnaryUpdateLoop<STATE_TYPE, INPUT_TYPE, OP>(UnifiedVectorFormat::GetData<INPUT_TYPE>(idata),
			                                            aggr_input_data, (STATE_TYPE *)state, count, idata.validity,
			                                            *idata.sel);
			break;
		}
		}
	}